

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O2

void compact_vector_suite::test_int64(void)

{
  allocator_type local_f9;
  value_type_conflict7 local_f8;
  vector<long,_std::allocator<long>_> value;
  value_type input [34];
  iarchive in;
  
  input[0x10] = 'b';
  input[0x11] = 'r';
  input[0x12] = '\x03';
  input[0x13] = '\x13';
  input[0x14] = '#';
  input[0x15] = '3';
  input[0x16] = 'C';
  input[0x17] = 'S';
  input[0x18] = 'c';
  input[0x19] = 's';
  input[0x1a] = '\x04';
  input[0x1b] = '\x14';
  input[0x1c] = '$';
  input[0x1d] = '4';
  input[0x1e] = 'D';
  input[0x1f] = 'T';
  input[0] = 0xae;
  input[1] = ' ';
  input[2] = '\x01';
  input[3] = '\x11';
  input[4] = '!';
  input[5] = '1';
  input[6] = 'A';
  input[7] = 'Q';
  input[8] = 'a';
  input[9] = 'q';
  input[10] = '\x02';
  input[0xb] = '\x12';
  input[0xc] = '\"';
  input[0xd] = '2';
  input[0xe] = 'B';
  input[0xf] = 'R';
  input[0x20] = 'd';
  input[0x21] = 't';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[34]>(&in,&input);
  local_f8 = 0x7fffffffffffffff;
  std::vector<long,_std::allocator<long>_>::vector(&value,4,&local_f8,&local_f9);
  trial::protocol::bintoken::iarchive::load_override<std::vector<long,std::allocator<long>>>
            (&in,&value);
  local_f8 = 0x7161514131211101;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[0]","INT64_C(0x7161514131211101)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x284,"void compact_vector_suite::test_int64()",
             value.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start,&local_f8);
  local_f8 = 0x7262524232221202;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[1]","INT64_C(0x7262524232221202)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x285,"void compact_vector_suite::test_int64()",
             value.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start + 1,&local_f8);
  local_f8 = 0x7363534333231303;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[2]","INT64_C(0x7363534333231303)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x286,"void compact_vector_suite::test_int64()",
             value.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start + 2,&local_f8);
  local_f8 = 0x7464544434241404;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("value[3]","INT64_C(0x7464544434241404)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x287,"void compact_vector_suite::test_int64()",
             value.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start + 3,&local_f8);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&value.super__Vector_base<long,_std::allocator<long>_>);
  trial::protocol::bintoken::iarchive::~iarchive(&in);
  return;
}

Assistant:

void test_int64()
{
    const value_type input[] = { token::code::array8_int64, 4 * token::int64::size,
                                 0x01, 0x11, 0x21, 0x31, 0x41, 0x51, 0x61, 0x71,
                                 0x02, 0x12, 0x22, 0x32, 0x42, 0x52, 0x62, 0x72,
                                 0x03, 0x13, 0x23, 0x33, 0x43, 0x53, 0x63, 0x73,
                                 0x04, 0x14, 0x24, 0x34, 0x44, 0x54, 0x64, 0x74 };
    format::iarchive in(input);
    std::vector<std::int64_t> value(4, std::numeric_limits<std::int64_t>::max());
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], INT64_C(0x7161514131211101));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], INT64_C(0x7262524232221202));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], INT64_C(0x7363534333231303));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], INT64_C(0x7464544434241404));
}